

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenGlobalGetSetName(BinaryenExpressionRef expr,char *name)

{
  bool bVar1;
  Name local_30;
  BinaryenExpressionRef local_20;
  Expression *expression;
  char *name_local;
  BinaryenExpressionRef expr_local;
  
  local_20 = expr;
  expression = (Expression *)name;
  name_local = (char *)expr;
  bVar1 = wasm::Expression::is<wasm::GlobalGet>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<GlobalGet>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x994,"void BinaryenGlobalGetSetName(BinaryenExpressionRef, const char *)");
  }
  if (expression != (Expression *)0x0) {
    wasm::Name::Name(&local_30,(char *)expression);
    wasm::Name::operator=((Name *)(local_20 + 1),&local_30);
    return;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x995,"void BinaryenGlobalGetSetName(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenGlobalGetSetName(BinaryenExpressionRef expr, const char* name) {
  auto* expression = (Expression*)expr;
  assert(expression->is<GlobalGet>());
  assert(name);
  static_cast<GlobalGet*>(expression)->name = name;
}